

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_move(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  int opsize;
  TCGContext_conflict2 *tcg_ctx;
  uint uVar1;
  TCGv_i32 val;
  TCGv_i32 pTVar2;
  undefined6 in_register_00000012;
  ulong uVar3;
  TCGv_i32 *ppTVar4;
  int reg0;
  uint reg0_00;
  uintptr_t o_1;
  
  uVar3 = CONCAT62(in_register_00000012,insn);
  uVar1 = ((uint)(uVar3 >> 0xc) & 0xfffff) - 1;
  if (2 < uVar1) {
    abort();
  }
  tcg_ctx = s->uc->tcg_ctx;
  opsize = *(int *)(&DAT_00d884fc + (ulong)uVar1 * 4);
  val = gen_ea_mode(env,s,(uint)uVar3 >> 3 & 7,(uint)uVar3 & 7,opsize,tcg_ctx->NULL_QREG,
                    (TCGv_i32 *)0x0,EA_LOADS,(uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (val != tcg_ctx->NULL_QREG) {
    uVar1 = (uint)(uVar3 >> 6) & 7;
    reg0_00 = (uint)(uVar3 >> 9) & 7;
    if (uVar1 == 1) {
      if (((uint)s->writeback_mask >> reg0_00 & 1) == 0) {
        ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
      }
      else {
        ppTVar4 = s->writeback;
      }
      if (ppTVar4[reg0_00] != val) {
        tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(ppTVar4[reg0_00] + (long)tcg_ctx),
                         (TCGArg)(val + (long)tcg_ctx));
        return;
      }
      return;
    }
    pTVar2 = gen_ea_mode(env,s,uVar1,reg0_00,opsize,val,(TCGv_i32 *)0x0,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar2 != tcg_ctx->NULL_QREG) {
      gen_logic_cc(s,val,opsize);
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(move)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv dest;
    int op;
    int opsize;

    switch (insn >> 12) {
    case 1: /* move.b */
        opsize = OS_BYTE;
        break;
    case 2: /* move.l */
        opsize = OS_LONG;
        break;
    case 3: /* move.w */
        opsize = OS_WORD;
        break;
    default:
        abort();
    }
    SRC_EA(env, src, opsize, 1, NULL);
    op = (insn >> 6) & 7;
    if (op == 1) {
        /* movea */
        /* The value will already have been sign extended.  */
        dest = AREG(insn, 9);
        tcg_gen_mov_i32(tcg_ctx, dest, src);
    } else {
        /* normal move */
        uint16_t dest_ea;
        dest_ea = ((insn >> 9) & 7) | (op << 3);
        DEST_EA(env, dest_ea, opsize, src, NULL);
        /* This will be correct because loads sign extend.  */
        gen_logic_cc(s, src, opsize);
    }
}